

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c++
# Opt level: O2

Leaf * __thiscall
kj::_::BTreeImpl::eraseHelper<kj::_::BTreeImpl::Leaf>
          (BTreeImpl *this,Leaf *node,Parent *parent,uint indexInParent,uint pos,MaybeUint **fixup)

{
  Leaf *src;
  MaybeUint *pMVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  NodeUnion *pNVar6;
  NodeUnion *pNVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  uint *puVar14;
  void *pvVar15;
  void *__ptr;
  Fault f;
  Fault local_38;
  
  if (parent == (Parent *)0x0) {
    return node;
  }
  if (node->rows[7].i != 0) {
    return node;
  }
  __ptr = (void *)(ulong)pos;
  if (indexInParent == 0) {
    if (parent->keys[0].i == 0) {
      Debug::Fault::Fault<kj::Exception::Type,char_const(&)[20]>
                (&local_38,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table.c++"
                 ,0x236,FAILED,(char *)0x0,"\"inconsistent b-tree\"",
                 (char (*) [20])"inconsistent b-tree");
      Debug::Fault::fatal(&local_38);
    }
    pMVar1 = parent->keys;
    pvVar15 = (void *)(ulong)parent->children[1];
    pNVar7 = this->tree;
    pNVar6 = pNVar7 + (long)pvVar15;
    puVar14 = pNVar7[(long)pvVar15].field_0.freelist.zero + 1;
    if (pNVar7[(long)pvVar15].field_0.freelist.zero[8] != 0) {
      uVar3 = *puVar14;
      node->rows[7].i = uVar3;
      pMVar1->i = uVar3;
      if (*fixup == pMVar1) {
        *fixup = (MaybeUint *)0x0;
      }
      uVar8 = *(undefined8 *)((long)&pNVar6->field_0 + 0xc);
      uVar9 = *(undefined8 *)((long)&pNVar6->field_0 + 0x14);
      uVar10 = *(undefined8 *)((long)&pNVar6->field_0 + 0x1c);
      uVar11 = *(undefined8 *)((long)&pNVar6->field_0 + 0x24);
      uVar12 = *(undefined8 *)((long)&pNVar6->field_0 + 0x2c);
      uVar13 = *(undefined8 *)((long)&pNVar6->field_0 + 0x34);
      pNVar7[(long)pvVar15].field_0.freelist.zero[0xd] = (pNVar6->field_0).freelist.zero[0xe];
      *(undefined8 *)((long)&pNVar7[(long)pvVar15].field_0 + 0x28) = uVar12;
      *(undefined8 *)((long)&pNVar7[(long)pvVar15].field_0 + 0x30) = uVar13;
      *(undefined8 *)((long)&pNVar7[(long)pvVar15].field_0 + 0x18) = uVar10;
      *(undefined8 *)((long)&pNVar7[(long)pvVar15].field_0 + 0x20) = uVar11;
      *(undefined8 *)puVar14 = uVar8;
      *(undefined8 *)((long)&pNVar7[(long)pvVar15].field_0 + 0x10) = uVar9;
      (pNVar6->field_0).freelist.zero[0xe] = 0;
      return node;
    }
    uVar8 = *(undefined8 *)puVar14;
    uVar9 = *(undefined8 *)((long)&pNVar7[(long)pvVar15].field_0 + 0x10);
    uVar10 = *(undefined8 *)((long)&pNVar7[(long)pvVar15].field_0 + 0x1c);
    *(undefined8 *)(node->rows + 10) = *(undefined8 *)((long)&pNVar7[(long)pvVar15].field_0 + 0x14);
    *(undefined8 *)(node->rows + 0xc) = uVar10;
    *(undefined8 *)(node->rows + 7) = uVar8;
    *(undefined8 *)(node->rows + 9) = uVar9;
    uVar5 = (pNVar6->field_0).leaf.next;
    node->next = uVar5;
    puVar14 = this->tree[uVar5].field_0.freelist.zero;
    if ((ulong)uVar5 == 0) {
      puVar14 = &this->endLeaf;
    }
    *puVar14 = pos;
    uVar8 = *(undefined8 *)(parent->keys + 3);
    *(undefined8 *)(parent->keys + 4) = *(undefined8 *)(parent->keys + 5);
    *(undefined8 *)pMVar1 = *(undefined8 *)(parent->keys + 1);
    *(undefined8 *)(parent->keys + 2) = uVar8;
    parent->keys[6].i = 0;
    *(undefined8 *)(parent->children + 5) = *(undefined8 *)(parent->children + 6);
    *(undefined8 *)(parent->children + 1) = *(undefined8 *)(parent->children + 2);
    *(undefined8 *)(parent->children + 3) = *(undefined8 *)(parent->children + 4);
    parent->children[7] = 0;
    free(this,pvVar15);
    if (*fixup == pMVar1) {
      *fixup = (MaybeUint *)0x0;
    }
    if (pMVar1->i != 0) {
      return node;
    }
    move(this,(Leaf *)this->tree,0,node);
  }
  else {
    uVar5 = indexInParent - 1;
    uVar2 = parent->children[uVar5];
    pvVar15 = (void *)(ulong)uVar2;
    pNVar6 = this->tree;
    src = (Leaf *)(pNVar6 + (long)pvVar15);
    if (pNVar6[(long)pvVar15].field_0.freelist.zero[8] != 0) {
      rotateRight(this,src,node,parent,uVar5);
      return node;
    }
    uVar8 = *(undefined8 *)node->rows;
    uVar9 = *(undefined8 *)(node->rows + 2);
    uVar10 = *(undefined8 *)(node->rows + 5);
    *(undefined8 *)((long)&pNVar6[(long)pvVar15].field_0 + 0x30) = *(undefined8 *)(node->rows + 3);
    *(undefined8 *)((long)&pNVar6[(long)pvVar15].field_0 + 0x38) = uVar10;
    *(undefined8 *)((long)&pNVar6[(long)pvVar15].field_0 + 0x24) = uVar8;
    *(undefined8 *)((long)&pNVar6[(long)pvVar15].field_0 + 0x2c) = uVar9;
    uVar4 = node->next;
    src->next = uVar4;
    puVar14 = this->tree[uVar4].field_0.freelist.zero;
    if ((ulong)uVar4 == 0) {
      puVar14 = &this->endLeaf;
    }
    *puVar14 = uVar2;
    Parent::eraseAfter(parent,uVar5);
    free(this,__ptr);
    if (*fixup == parent->keys + indexInParent) {
      *fixup = *fixup + -1;
    }
    if (parent->keys[0].i != 0) {
      return src;
    }
    move(this,(Leaf *)this->tree,0,src);
    __ptr = pvVar15;
  }
  free(this,__ptr);
  this->height = this->height - 1;
  return (Leaf *)this->tree;
}

Assistant:

Node& BTreeImpl::eraseHelper(
    Node& node, Parent* parent, uint indexInParent, uint pos, MaybeUint*& fixup) {
  if (parent != nullptr && !node.isMostlyFull()) {
    // This is not the root, but it's only half-full. Rebalance.
    KJ_DASSERT(node.isHalfFull());

    if (indexInParent > 0) {
      // There's a sibling to the left.
      uint sibPos = parent->children[indexInParent - 1];
      Node& sib = tree[sibPos];
      if (sib.isMostlyFull()) {
        // Left sibling is more than half full. Steal one member.
        rotateRight(sib, node, *parent, indexInParent - 1);
        return node;
      } else {
        // Left sibling is half full, too. Merge.
        KJ_ASSERT(sib.isHalfFull());
        merge(sib, sibPos, *parent->keys[indexInParent - 1], node);
        parent->eraseAfter(indexInParent - 1);
        free(pos);
        if (fixup == &parent->keys[indexInParent]) --fixup;

        if (parent->keys[0] == nullptr) {
          // Oh hah, the parent has no keys left. It must be the root. We can eliminate it.
          KJ_DASSERT(parent == &tree->parent);
          compilerBarrier();  // don't reorder any writes to parent below here
          move(tree[0], 0, sib);
          free(sibPos);
          --height;
          return tree[0];
        } else {
          return sib;
        }
      }
    } else if (indexInParent < Parent::NKEYS && parent->keys[indexInParent] != nullptr) {
      // There's a sibling to the right.
      uint sibPos = parent->children[indexInParent + 1];
      Node& sib = tree[sibPos];
      if (sib.isMostlyFull()) {
        // Right sibling is more than half full. Steal one member.
        rotateLeft(node, sib, *parent, indexInParent, fixup);
        return node;
      } else {
        // Right sibling is half full, too. Merge.
        KJ_ASSERT(sib.isHalfFull());
        merge(node, pos, *parent->keys[indexInParent], sib);
        parent->eraseAfter(indexInParent);
        free(sibPos);
        if (fixup == &parent->keys[indexInParent]) fixup = nullptr;

        if (parent->keys[0] == nullptr) {
          // Oh hah, the parent has no keys left. It must be the root. We can eliminate it.
          KJ_DASSERT(parent == &tree->parent);
          compilerBarrier();  // don't reorder any writes to parent below here
          move(tree[0], 0, node);
          free(pos);
          --height;
          return tree[0];
        } else {
          return node;
        }
      }
    } else {
      KJ_FAIL_ASSERT("inconsistent b-tree");
    }
  }

  return node;
}